

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests::acceptLeftButtonDownOnCoveredStockPileCards
          (EventsProcessorTests *this,MouseLeftButtonDown *event)

{
  MockSpec<bool_(const_solitaire::geometry::Position_&)> *this_00;
  TypedExpectation<bool_(const_solitaire::geometry::Position_&)> *this_01;
  MockSpec<solitaire::interfaces::Solitaire_&()> *this_02;
  TypedExpectation<solitaire::interfaces::Solitaire_&()> *this_03;
  MockSpec<void_()> *this_04;
  ContextMock *this_05;
  SolitaireMock *this_06;
  WithoutMatchers local_e1;
  MockSpec<void_()> local_e0;
  StrictMock<solitaire::SolitaireMock> *local_d0;
  undefined1 local_c8 [40];
  MockSpec<solitaire::interfaces::Solitaire_&()> local_a0;
  ReturnAction<bool> local_90;
  undefined1 local_80 [48];
  Matcher<const_solitaire::geometry::Position_&> local_50;
  MockSpec<bool_(const_solitaire::geometry::Position_&)> local_38;
  MouseLeftButtonDown *local_18;
  MouseLeftButtonDown *event_local;
  EventsProcessorTests *this_local;
  
  local_18 = event;
  event_local = (MouseLeftButtonDown *)this;
  testing::Matcher<const_solitaire::geometry::Position_&>::Matcher(&local_50,&event->position);
  colliders::StockPileColliderMock::gmock_coveredCardsCollidesWith
            (&local_38,&(this->stockPileColliderMock).super_StockPileColliderMock,&local_50);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::operator()
                      (&local_38,(WithoutMatchers *)(local_80 + 0x23),(void *)0x0);
  this_01 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                               ,0x7b,"stockPileColliderMock",
                               "coveredCardsCollidesWith(event.position)");
  testing::Return<bool>((testing *)&local_90,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(const_solitaire::geometry::Position_&)> *)local_80,
             (ReturnAction *)&local_90);
  this_05 = (ContextMock *)local_80;
  testing::internal::TypedExpectation<bool_(const_solitaire::geometry::Position_&)>::WillOnce
            (this_01,(Action<bool_(const_solitaire::geometry::Position_&)> *)this_05);
  testing::Action<bool_(const_solitaire::geometry::Position_&)>::~Action
            ((Action<bool_(const_solitaire::geometry::Position_&)> *)local_80);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_90);
  testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::~MockSpec(&local_38);
  testing::Matcher<const_solitaire::geometry::Position_&>::~Matcher(&local_50);
  local_a0.function_mocker_ =
       (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)
       ContextMock::gmock_getSolitaire
                 ((MockSpec<solitaire::interfaces::Solitaire_&()> *)&this->contextMock,this_05);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::operator()
                      (&local_a0,(WithoutMatchers *)(local_c8 + 0x27),(void *)0x0);
  this_03 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x7d,"contextMock","getSolitaire()");
  local_d0 = (StrictMock<solitaire::SolitaireMock> *)
             testing::ReturnRef<testing::StrictMock<solitaire::SolitaireMock>>(&this->solitaireMock)
  ;
  this_06 = (SolitaireMock *)local_c8;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)this_06,(ReturnRefAction *)&local_d0);
  testing::internal::TypedExpectation<solitaire::interfaces::Solitaire_&()>::WillOnce
            (this_03,(Action<solitaire::interfaces::Solitaire_&()> *)this_06);
  testing::Action<solitaire::interfaces::Solitaire_&()>::~Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)local_c8);
  local_e0.function_mocker_ =
       (FunctionMocker<void_()> *)
       SolitaireMock::gmock_trySelectNextStockPileCard
                 ((MockSpec<void_()> *)&this->solitaireMock,this_06);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::MockSpec<void_()>::operator()(&local_e0,&local_e1,(void *)0x0);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (this_04,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
             ,0x7e,"solitaireMock","trySelectNextStockPileCard()");
  return;
}

Assistant:

void acceptLeftButtonDownOnCoveredStockPileCards(const MouseLeftButtonDown& event) {
        EXPECT_CALL(stockPileColliderMock, coveredCardsCollidesWith(event.position))
            .WillOnce(Return(true));
        EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
        EXPECT_CALL(solitaireMock, trySelectNextStockPileCard());
    }